

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 *puVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 *puVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  Scene *pSVar30;
  Geometry *pGVar31;
  long lVar32;
  long lVar33;
  RTCFilterFunctionN p_Var34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined8 uVar43;
  undefined8 uVar44;
  int iVar45;
  AABBNodeMB4D *node1;
  ulong uVar46;
  uint uVar47;
  NodeRef *pNVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  ulong uVar60;
  size_t sVar61;
  ulong uVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar77;
  float fVar80;
  float fVar81;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar88;
  float fVar89;
  undefined1 auVar86 [16];
  float fVar90;
  undefined1 auVar87 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar125 [16];
  float fVar129;
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar139 [16];
  float fVar146;
  float fVar147;
  float fVar151;
  float fVar152;
  undefined1 auVar148 [16];
  float fVar153;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar159;
  float fVar162;
  undefined1 auVar157 [16];
  float fVar160;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar158 [16];
  UVIdentity<4> mapUV;
  NodeRef *local_b58;
  NodeRef *local_b50;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float fStack_b30;
  float fStack_b2c;
  float fStack_ae0;
  float fStack_adc;
  float fStack_ad0;
  float fStack_acc;
  undefined8 local_ac8;
  undefined1 local_a78 [16];
  undefined1 (*local_a68) [16];
  ulong local_a60;
  long local_a58;
  long local_a50;
  RTCFilterFunctionNArguments args;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  UVIdentity<4> *local_8e8;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  local_b50 = stack + 1;
  stack[0] = root;
  fVar25 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar26 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar27 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar106 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar122 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar123 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar135 = fVar106 * 0.99999964;
  fVar136 = fVar122 * 0.99999964;
  fVar129 = fVar123 * 0.99999964;
  fVar106 = fVar106 * 1.0000004;
  fVar122 = fVar122 * 1.0000004;
  fVar123 = fVar123 * 1.0000004;
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar52 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar53 = uVar59 ^ 0x10;
  iVar45 = (tray->tnear).field_0.i[k];
  auVar148._4_4_ = iVar45;
  auVar148._0_4_ = iVar45;
  auVar148._8_4_ = iVar45;
  auVar148._12_4_ = iVar45;
  iVar45 = (tray->tfar).field_0.i[k];
  auVar157._4_4_ = iVar45;
  auVar157._0_4_ = iVar45;
  auVar157._8_4_ = iVar45;
  auVar157._12_4_ = iVar45;
  local_a68 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_a60 = uVar59;
  do {
    if (local_b50 == stack) {
LAB_006fd22e:
      return local_b50 != stack;
    }
    local_b58 = local_b50 + -1;
    sVar61 = local_b50[-1].ptr;
    pNVar48 = local_b50;
    while ((sVar61 & 8) == 0) {
      uVar46 = sVar61 & 0xfffffffffffffff0;
      fVar63 = *(float *)(ray + k * 4 + 0x70);
      pfVar24 = (float *)(uVar46 + 0x80 + uVar59);
      pfVar23 = (float *)(uVar46 + 0x20 + uVar59);
      auVar69._0_4_ = ((*pfVar24 * fVar63 + *pfVar23) - fVar25) * fVar135;
      auVar69._4_4_ = ((pfVar24[1] * fVar63 + pfVar23[1]) - fVar25) * fVar135;
      auVar69._8_4_ = ((pfVar24[2] * fVar63 + pfVar23[2]) - fVar25) * fVar135;
      auVar69._12_4_ = ((pfVar24[3] * fVar63 + pfVar23[3]) - fVar25) * fVar135;
      auVar69 = maxps(auVar148,auVar69);
      pfVar24 = (float *)(uVar46 + 0x80 + uVar52);
      pfVar23 = (float *)(uVar46 + 0x20 + uVar52);
      auVar78._0_4_ = ((*pfVar24 * fVar63 + *pfVar23) - fVar26) * fVar136;
      auVar78._4_4_ = ((pfVar24[1] * fVar63 + pfVar23[1]) - fVar26) * fVar136;
      auVar78._8_4_ = ((pfVar24[2] * fVar63 + pfVar23[2]) - fVar26) * fVar136;
      auVar78._12_4_ = ((pfVar24[3] * fVar63 + pfVar23[3]) - fVar26) * fVar136;
      pfVar24 = (float *)(uVar46 + 0x80 + uVar62);
      pfVar23 = (float *)(uVar46 + 0x20 + uVar62);
      auVar84._0_4_ = ((*pfVar24 * fVar63 + *pfVar23) - fVar27) * fVar129;
      auVar84._4_4_ = ((pfVar24[1] * fVar63 + pfVar23[1]) - fVar27) * fVar129;
      auVar84._8_4_ = ((pfVar24[2] * fVar63 + pfVar23[2]) - fVar27) * fVar129;
      auVar84._12_4_ = ((pfVar24[3] * fVar63 + pfVar23[3]) - fVar27) * fVar129;
      auVar78 = maxps(auVar78,auVar84);
      auVar69 = maxps(auVar69,auVar78);
      pfVar24 = (float *)(uVar46 + 0x80 + uVar53);
      pfVar23 = (float *)(uVar46 + 0x20 + uVar53);
      auVar82._0_4_ = ((*pfVar24 * fVar63 + *pfVar23) - fVar25) * fVar106;
      auVar82._4_4_ = ((pfVar24[1] * fVar63 + pfVar23[1]) - fVar25) * fVar106;
      auVar82._8_4_ = ((pfVar24[2] * fVar63 + pfVar23[2]) - fVar25) * fVar106;
      auVar82._12_4_ = ((pfVar24[3] * fVar63 + pfVar23[3]) - fVar25) * fVar106;
      auVar78 = minps(auVar157,auVar82);
      pfVar24 = (float *)(uVar46 + 0x80 + (uVar52 ^ 0x10));
      pfVar23 = (float *)(uVar46 + 0x20 + (uVar52 ^ 0x10));
      auVar83._0_4_ = ((*pfVar24 * fVar63 + *pfVar23) - fVar26) * fVar122;
      auVar83._4_4_ = ((pfVar24[1] * fVar63 + pfVar23[1]) - fVar26) * fVar122;
      auVar83._8_4_ = ((pfVar24[2] * fVar63 + pfVar23[2]) - fVar26) * fVar122;
      auVar83._12_4_ = ((pfVar24[3] * fVar63 + pfVar23[3]) - fVar26) * fVar122;
      pfVar24 = (float *)(uVar46 + 0x80 + (uVar62 ^ 0x10));
      pfVar23 = (float *)(uVar46 + 0x20 + (uVar62 ^ 0x10));
      auVar86._0_4_ = ((*pfVar24 * fVar63 + *pfVar23) - fVar27) * fVar123;
      auVar86._4_4_ = ((pfVar24[1] * fVar63 + pfVar23[1]) - fVar27) * fVar123;
      auVar86._8_4_ = ((pfVar24[2] * fVar63 + pfVar23[2]) - fVar27) * fVar123;
      auVar86._12_4_ = ((pfVar24[3] * fVar63 + pfVar23[3]) - fVar27) * fVar123;
      auVar84 = minps(auVar83,auVar86);
      auVar78 = minps(auVar78,auVar84);
      bVar35 = auVar69._0_4_ <= auVar78._0_4_;
      bVar36 = auVar69._4_4_ <= auVar78._4_4_;
      bVar37 = auVar69._8_4_ <= auVar78._8_4_;
      bVar38 = auVar69._12_4_ <= auVar78._12_4_;
      if (((uint)sVar61 & 7) == 6) {
        bVar35 = (fVar63 < *(float *)(uVar46 + 0xf0) && *(float *)(uVar46 + 0xe0) <= fVar63) &&
                 bVar35;
        bVar36 = (fVar63 < *(float *)(uVar46 + 0xf4) && *(float *)(uVar46 + 0xe4) <= fVar63) &&
                 bVar36;
        bVar37 = (fVar63 < *(float *)(uVar46 + 0xf8) && *(float *)(uVar46 + 0xe8) <= fVar63) &&
                 bVar37;
        bVar38 = (fVar63 < *(float *)(uVar46 + 0xfc) && *(float *)(uVar46 + 0xec) <= fVar63) &&
                 bVar38;
      }
      auVar70._0_4_ = (uint)bVar35 * -0x80000000;
      auVar70._4_4_ = (uint)bVar36 * -0x80000000;
      auVar70._8_4_ = (uint)bVar37 * -0x80000000;
      auVar70._12_4_ = (uint)bVar38 * -0x80000000;
      uVar47 = movmskps((int)pNVar48,auVar70);
      if (uVar47 == 0) goto LAB_006fd203;
      uVar47 = uVar47 & 0xff;
      lVar58 = 0;
      if (uVar47 != 0) {
        for (; (uVar47 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
        }
      }
      sVar61 = *(size_t *)(uVar46 + lVar58 * 8);
      uVar47 = uVar47 - 1 & uVar47;
      pNVar48 = (NodeRef *)(ulong)uVar47;
      if (uVar47 != 0) {
        do {
          local_b58->ptr = sVar61;
          local_b58 = local_b58 + 1;
          lVar58 = 0;
          if (pNVar48 != (NodeRef *)0x0) {
            for (; ((ulong)pNVar48 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
            }
          }
          sVar61 = *(size_t *)(uVar46 + lVar58 * 8);
          pNVar48 = (NodeRef *)((ulong)((long)&pNVar48[-1].ptr + 7U) & (ulong)pNVar48);
        } while (pNVar48 != (NodeRef *)0x0);
      }
    }
    local_a50 = (ulong)((uint)sVar61 & 0xf) - 8;
    uVar46 = sVar61 & 0xfffffffffffffff0;
    for (local_a58 = 0; local_a58 != local_a50; local_a58 = local_a58 + 1) {
      lVar58 = local_a58 * 0x50;
      pSVar30 = context->scene;
      pGVar31 = (pSVar30->geometries).items[*(uint *)(uVar46 + 0x30 + lVar58)].ptr;
      fVar63 = (pGVar31->time_range).lower;
      fVar76 = (pGVar31->time_range).upper - fVar63;
      fVar97 = ((*(float *)(ray + k * 4 + 0x70) - fVar63) / fVar76) * pGVar31->fnumTimeSegments;
      auVar79 = roundss(ZEXT416((uint)fVar76),ZEXT416((uint)fVar97),9);
      fVar63 = pGVar31->fnumTimeSegments + -1.0;
      if (fVar63 <= auVar79._0_4_) {
        auVar79._0_4_ = fVar63;
      }
      fVar63 = 0.0;
      if (0.0 <= auVar79._0_4_) {
        fVar63 = auVar79._0_4_;
      }
      uVar60 = (ulong)*(uint *)(uVar46 + 4 + lVar58);
      lVar32 = *(long *)(*(long *)&pGVar31[2].numPrimitives + (long)(int)fVar63 * 0x38);
      lVar33 = *(long *)(*(long *)&pGVar31[2].numPrimitives + 0x38 + (long)(int)fVar63 * 0x38);
      pfVar23 = (float *)(lVar32 + (ulong)*(uint *)(uVar46 + lVar58) * 4);
      uVar54 = (ulong)*(uint *)(uVar46 + 0x10 + lVar58);
      pfVar24 = (float *)(lVar32 + uVar54 * 4);
      uVar55 = (ulong)*(uint *)(uVar46 + 0x20 + lVar58);
      puVar1 = (undefined8 *)(lVar32 + uVar55 * 4);
      uVar43 = *puVar1;
      uVar44 = puVar1[1];
      pfVar2 = (float *)(lVar32 + uVar60 * 4);
      uVar59 = (ulong)*(uint *)(uVar46 + 0x14 + lVar58);
      pfVar3 = (float *)(lVar32 + uVar59 * 4);
      uVar47 = *(uint *)(uVar46 + 0x24 + lVar58);
      pfVar4 = (float *)(lVar32 + (ulong)uVar47 * 4);
      uVar56 = (ulong)*(uint *)(uVar46 + 8 + lVar58);
      pfVar5 = (float *)(lVar32 + uVar56 * 4);
      puVar6 = (undefined4 *)(lVar32 + (ulong)*(uint *)(uVar46 + 0x18 + lVar58) * 4);
      uVar49 = (ulong)*(uint *)(uVar46 + 0x28 + lVar58);
      pfVar7 = (float *)(lVar32 + uVar49 * 4);
      uVar57 = (ulong)*(uint *)(uVar46 + 0xc + lVar58);
      pfVar8 = (float *)(lVar32 + uVar57 * 4);
      uVar50 = (ulong)*(uint *)(uVar46 + 0x1c + lVar58);
      puVar9 = (undefined4 *)(lVar32 + uVar50 * 4);
      uVar51 = (ulong)*(uint *)(uVar46 + 0x2c + lVar58);
      pfVar10 = (float *)(lVar32 + uVar51 * 4);
      pfVar11 = (float *)(lVar33 + (ulong)*(uint *)(uVar46 + lVar58) * 4);
      pfVar12 = (float *)(lVar33 + uVar54 * 4);
      fVar97 = fVar97 - fVar63;
      pfVar13 = (float *)(lVar33 + uVar60 * 4);
      pfVar14 = (float *)(lVar33 + uVar56 * 4);
      local_ac8 = CONCAT44(*puVar9,*puVar6);
      local_b48 = (float)uVar43;
      fStack_b44 = (float)((ulong)uVar43 >> 0x20);
      fStack_b40 = (float)uVar44;
      pfVar15 = (float *)(lVar33 + uVar57 * 4);
      pfVar16 = (float *)(lVar33 + local_ac8 * 4);
      pfVar17 = (float *)(lVar33 + uVar59 * 4);
      pfVar18 = (float *)(lVar33 + uVar50 * 4);
      pfVar19 = (float *)(lVar33 + uVar55 * 4);
      pfVar20 = (float *)(lVar33 + uVar49 * 4);
      pfVar21 = (float *)(lVar33 + (ulong)uVar47 * 4);
      pfVar22 = (float *)(lVar33 + uVar51 * 4);
      fVar146 = 1.0 - fVar97;
      fStack_b3c = (float)((ulong)uVar44 >> 0x20);
      puVar1 = (undefined8 *)(uVar46 + 0x30 + lVar58);
      local_928 = *puVar1;
      uStack_920 = puVar1[1];
      puVar1 = (undefined8 *)(uVar46 + 0x40 + lVar58);
      local_938 = *puVar1;
      uStack_930 = puVar1[1];
      fVar63 = *(float *)(ray + k * 4);
      fVar76 = *(float *)(ray + k * 4 + 0x10);
      fVar153 = *(float *)(ray + k * 4 + 0x20);
      fVar98 = (*pfVar23 * fVar146 + *pfVar11 * fVar97) - fVar63;
      fVar99 = (*pfVar2 * fVar146 + *pfVar13 * fVar97) - fVar63;
      fVar100 = (*pfVar5 * fVar146 + *pfVar14 * fVar97) - fVar63;
      fVar101 = (*pfVar8 * fVar146 + *pfVar15 * fVar97) - fVar63;
      fVar137 = (pfVar23[1] * fVar146 + pfVar11[1] * fVar97) - fVar76;
      fVar140 = (pfVar2[1] * fVar146 + pfVar13[1] * fVar97) - fVar76;
      fVar142 = (pfVar5[1] * fVar146 + pfVar14[1] * fVar97) - fVar76;
      fVar144 = (pfVar8[1] * fVar146 + pfVar15[1] * fVar97) - fVar76;
      fVar91 = (pfVar23[2] * fVar146 + pfVar11[2] * fVar97) - fVar153;
      fVar93 = (pfVar2[2] * fVar146 + pfVar13[2] * fVar97) - fVar153;
      fStack_ae0 = (fStack_ae0 * fVar146 + pfVar14[2] * fVar97) - fVar153;
      fStack_adc = (fStack_adc * fVar146 + pfVar15[2] * fVar97) - fVar153;
      fVar102 = (*pfVar24 * fVar146 + *pfVar12 * fVar97) - fVar63;
      fVar103 = (*pfVar3 * fVar146 + *pfVar17 * fVar97) - fVar63;
      fVar104 = (fStack_ad0 * fVar146 + *pfVar16 * fVar97) - fVar63;
      fVar105 = (fStack_acc * fVar146 + *pfVar18 * fVar97) - fVar63;
      fVar154 = (pfVar24[1] * fVar146 + pfVar12[1] * fVar97) - fVar76;
      fVar159 = (pfVar3[1] * fVar146 + pfVar17[1] * fVar97) - fVar76;
      fVar162 = ((float)puVar6[1] * fVar146 + pfVar16[1] * fVar97) - fVar76;
      fVar165 = ((float)puVar9[1] * fVar146 + pfVar18[1] * fVar97) - fVar76;
      fVar107 = (pfVar7[2] * fVar146 + pfVar12[2] * fVar97) - fVar153;
      fVar111 = (pfVar10[2] * fVar146 + pfVar17[2] * fVar97) - fVar153;
      fVar115 = (fStack_b30 * fVar146 + pfVar16[2] * fVar97) - fVar153;
      fVar119 = (fStack_b2c * fVar146 + pfVar18[2] * fVar97) - fVar153;
      fVar108 = (local_b48 * fVar146 + *pfVar19 * fVar97) - fVar63;
      fVar112 = (*pfVar4 * fVar146 + *pfVar21 * fVar97) - fVar63;
      fVar116 = (*pfVar7 * fVar146 + *pfVar20 * fVar97) - fVar63;
      fVar63 = (*pfVar10 * fVar146 + *pfVar22 * fVar97) - fVar63;
      fVar77 = (fStack_b44 * fVar146 + pfVar19[1] * fVar97) - fVar76;
      fVar80 = (pfVar4[1] * fVar146 + pfVar21[1] * fVar97) - fVar76;
      fVar81 = (pfVar7[1] * fVar146 + pfVar20[1] * fVar97) - fVar76;
      fVar76 = (pfVar10[1] * fVar146 + pfVar22[1] * fVar97) - fVar76;
      fVar147 = (fVar146 * fStack_b40 + fVar97 * pfVar19[2]) - fVar153;
      fVar151 = (fVar146 * pfVar4[2] + fVar97 * pfVar21[2]) - fVar153;
      fVar152 = (fVar146 * fStack_b40 + fVar97 * pfVar20[2]) - fVar153;
      fVar153 = (fVar146 * fStack_b3c + fVar97 * pfVar22[2]) - fVar153;
      fVar85 = fVar108 - fVar98;
      fVar88 = fVar112 - fVar99;
      fVar89 = fVar116 - fVar100;
      fVar90 = fVar63 - fVar101;
      fVar124 = fVar77 - fVar137;
      fVar126 = fVar80 - fVar140;
      fVar127 = fVar81 - fVar142;
      fVar128 = fVar76 - fVar144;
      fVar109 = fVar147 - fVar91;
      fVar113 = fVar151 - fVar93;
      fVar117 = fVar152 - fStack_ae0;
      fVar120 = fVar153 - fStack_adc;
      fVar97 = *(float *)(ray + k * 4 + 0x50);
      fStack_b30 = *(float *)(ray + k * 4 + 0x60);
      fVar146 = *(float *)(ray + k * 4 + 0x40);
      local_918 = (fVar124 * (fVar147 + fVar91) - (fVar77 + fVar137) * fVar109) * fVar146 +
                  ((fVar108 + fVar98) * fVar109 - (fVar147 + fVar91) * fVar85) * fVar97 +
                  (fVar85 * (fVar77 + fVar137) - (fVar108 + fVar98) * fVar124) * fStack_b30;
      fStack_914 = (fVar126 * (fVar151 + fVar93) - (fVar80 + fVar140) * fVar113) * fVar146 +
                   ((fVar112 + fVar99) * fVar113 - (fVar151 + fVar93) * fVar88) * fVar97 +
                   (fVar88 * (fVar80 + fVar140) - (fVar112 + fVar99) * fVar126) * fStack_b30;
      fStack_910 = (fVar127 * (fVar152 + fStack_ae0) - (fVar81 + fVar142) * fVar117) * fVar146 +
                   ((fVar116 + fVar100) * fVar117 - (fVar152 + fStack_ae0) * fVar89) * fVar97 +
                   (fVar89 * (fVar81 + fVar142) - (fVar116 + fVar100) * fVar127) * fStack_b30;
      fStack_90c = (fVar128 * (fVar153 + fStack_adc) - (fVar76 + fVar144) * fVar120) * fVar146 +
                   ((fVar63 + fVar101) * fVar120 - (fVar153 + fStack_adc) * fVar90) * fVar97 +
                   (fVar90 * (fVar76 + fVar144) - (fVar63 + fVar101) * fVar128) * fStack_b30;
      fVar130 = fVar98 - fVar102;
      fVar132 = fVar99 - fVar103;
      fVar133 = fVar100 - fVar104;
      fVar134 = fVar101 - fVar105;
      fVar138 = fVar137 - fVar154;
      fVar141 = fVar140 - fVar159;
      fVar143 = fVar142 - fVar162;
      fVar145 = fVar144 - fVar165;
      fVar155 = fVar91 - fVar107;
      fVar160 = fVar93 - fVar111;
      fVar163 = fStack_ae0 - fVar115;
      fVar166 = fStack_adc - fVar119;
      local_908._0_4_ =
           (fVar138 * (fVar91 + fVar107) - (fVar137 + fVar154) * fVar155) * fVar146 +
           ((fVar98 + fVar102) * fVar155 - (fVar91 + fVar107) * fVar130) * fVar97 +
           (fVar130 * (fVar137 + fVar154) - (fVar98 + fVar102) * fVar138) * fStack_b30;
      local_908._4_4_ =
           (fVar141 * (fVar93 + fVar111) - (fVar140 + fVar159) * fVar160) * fVar146 +
           ((fVar99 + fVar103) * fVar160 - (fVar93 + fVar111) * fVar132) * fVar97 +
           (fVar132 * (fVar140 + fVar159) - (fVar99 + fVar103) * fVar141) * fStack_b30;
      local_908._8_4_ =
           (fVar143 * (fStack_ae0 + fVar115) - (fVar142 + fVar162) * fVar163) * fVar146 +
           ((fVar100 + fVar104) * fVar163 - (fStack_ae0 + fVar115) * fVar133) * fVar97 +
           (fVar133 * (fVar142 + fVar162) - (fVar100 + fVar104) * fVar143) * fStack_b30;
      local_908._12_4_ =
           (fVar145 * (fStack_adc + fVar119) - (fVar144 + fVar165) * fVar166) * fVar146 +
           ((fVar101 + fVar105) * fVar166 - (fStack_adc + fVar119) * fVar134) * fVar97 +
           (fVar134 * (fVar144 + fVar165) - (fVar101 + fVar105) * fVar145) * fStack_b30;
      fVar156 = fVar102 - fVar108;
      fVar161 = fVar103 - fVar112;
      fVar164 = fVar104 - fVar116;
      fVar167 = fVar105 - fVar63;
      fVar92 = fVar154 - fVar77;
      fVar94 = fVar159 - fVar80;
      fVar95 = fVar162 - fVar81;
      fVar96 = fVar165 - fVar76;
      fVar110 = fVar107 - fVar147;
      fVar114 = fVar111 - fVar151;
      fVar118 = fVar115 - fVar152;
      fVar121 = fVar119 - fVar153;
      auVar64._0_4_ =
           (fVar92 * (fVar147 + fVar107) - (fVar77 + fVar154) * fVar110) * fVar146 +
           ((fVar108 + fVar102) * fVar110 - (fVar147 + fVar107) * fVar156) * fVar97 +
           (fVar156 * (fVar77 + fVar154) - (fVar108 + fVar102) * fVar92) * fStack_b30;
      auVar64._4_4_ =
           (fVar94 * (fVar151 + fVar111) - (fVar80 + fVar159) * fVar114) * fVar146 +
           ((fVar112 + fVar103) * fVar114 - (fVar151 + fVar111) * fVar161) * fVar97 +
           (fVar161 * (fVar80 + fVar159) - (fVar112 + fVar103) * fVar94) * fStack_b30;
      auVar64._8_4_ =
           (fVar95 * (fVar152 + fVar115) - (fVar81 + fVar162) * fVar118) * fVar146 +
           ((fVar116 + fVar104) * fVar118 - (fVar152 + fVar115) * fVar164) * fVar97 +
           (fVar164 * (fVar81 + fVar162) - (fVar116 + fVar104) * fVar95) * fStack_b30;
      auVar64._12_4_ =
           (fVar96 * (fVar153 + fVar119) - (fVar76 + fVar165) * fVar121) * fVar146 +
           ((fVar63 + fVar105) * fVar121 - (fVar153 + fVar119) * fVar167) * fVar97 +
           (fVar167 * (fVar76 + fVar165) - (fVar63 + fVar105) * fVar96) * fStack_b30;
      fVar80 = local_918 + local_908._0_4_ + auVar64._0_4_;
      fVar81 = fStack_914 + local_908._4_4_ + auVar64._4_4_;
      fVar102 = fStack_910 + local_908._8_4_ + auVar64._8_4_;
      fVar103 = fStack_90c + local_908._12_4_ + auVar64._12_4_;
      auVar71._4_4_ = fStack_914;
      auVar71._0_4_ = local_918;
      auVar71._8_4_ = fStack_910;
      auVar71._12_4_ = fStack_90c;
      auVar69 = minps(auVar71,local_908);
      auVar69 = minps(auVar69,auVar64);
      auVar149._4_4_ = fStack_914;
      auVar149._0_4_ = local_918;
      auVar149._8_4_ = fStack_910;
      auVar149._12_4_ = fStack_90c;
      auVar78 = maxps(auVar149,local_908);
      auVar78 = maxps(auVar78,auVar64);
      fVar63 = ABS(fVar80) * 1.1920929e-07;
      fVar76 = ABS(fVar81) * 1.1920929e-07;
      fVar153 = ABS(fVar102) * 1.1920929e-07;
      fVar77 = ABS(fVar103) * 1.1920929e-07;
      auVar150._4_4_ = -(uint)(auVar78._4_4_ <= fVar76);
      auVar150._0_4_ = -(uint)(auVar78._0_4_ <= fVar63);
      auVar150._8_4_ = -(uint)(auVar78._8_4_ <= fVar153);
      auVar150._12_4_ = -(uint)(auVar78._12_4_ <= fVar77);
      auVar72._4_4_ = -(uint)(-fVar76 <= auVar69._4_4_);
      auVar72._0_4_ = -(uint)(-fVar63 <= auVar69._0_4_);
      auVar72._8_4_ = -(uint)(-fVar153 <= auVar69._8_4_);
      auVar72._12_4_ = -(uint)(-fVar77 <= auVar69._12_4_);
      auVar150 = auVar150 | auVar72;
      iVar45 = movmskps(uVar47,auVar150);
      fStack_b2c = fStack_b30;
      if (iVar45 != 0) {
        auVar125._0_4_ = fVar138 * fVar110 - fVar92 * fVar155;
        auVar125._4_4_ = fVar141 * fVar114 - fVar94 * fVar160;
        auVar125._8_4_ = fVar143 * fVar118 - fVar95 * fVar163;
        auVar125._12_4_ = fVar145 * fVar121 - fVar96 * fVar166;
        auVar65._4_4_ = -(uint)(ABS(fVar141 * fVar113) < ABS(fVar94 * fVar160));
        auVar65._0_4_ = -(uint)(ABS(fVar138 * fVar109) < ABS(fVar92 * fVar155));
        auVar65._8_4_ = -(uint)(ABS(fVar143 * fVar117) < ABS(fVar95 * fVar163));
        auVar65._12_4_ = -(uint)(ABS(fVar145 * fVar120) < ABS(fVar96 * fVar166));
        auVar40._4_4_ = fVar126 * fVar160 - fVar141 * fVar113;
        auVar40._0_4_ = fVar124 * fVar155 - fVar138 * fVar109;
        auVar40._8_4_ = fVar127 * fVar163 - fVar143 * fVar117;
        auVar40._12_4_ = fVar128 * fVar166 - fVar145 * fVar120;
        local_898 = blendvps(auVar125,auVar40,auVar65);
        auVar158._0_4_ = fVar156 * fVar155 - fVar130 * fVar110;
        auVar158._4_4_ = fVar161 * fVar160 - fVar132 * fVar114;
        auVar158._8_4_ = fVar164 * fVar163 - fVar133 * fVar118;
        auVar158._12_4_ = fVar167 * fVar166 - fVar134 * fVar121;
        auVar66._4_4_ = -(uint)(ABS(fVar88 * fVar160) < ABS(fVar132 * fVar114));
        auVar66._0_4_ = -(uint)(ABS(fVar85 * fVar155) < ABS(fVar130 * fVar110));
        auVar66._8_4_ = -(uint)(ABS(fVar89 * fVar163) < ABS(fVar133 * fVar118));
        auVar66._12_4_ = -(uint)(ABS(fVar90 * fVar166) < ABS(fVar134 * fVar121));
        auVar41._4_4_ = fVar113 * fVar132 - fVar88 * fVar160;
        auVar41._0_4_ = fVar109 * fVar130 - fVar85 * fVar155;
        auVar41._8_4_ = fVar117 * fVar133 - fVar89 * fVar163;
        auVar41._12_4_ = fVar120 * fVar134 - fVar90 * fVar166;
        local_888 = blendvps(auVar158,auVar41,auVar66);
        auVar131._0_4_ = fVar130 * fVar92 - fVar156 * fVar138;
        auVar131._4_4_ = fVar132 * fVar94 - fVar161 * fVar141;
        auVar131._8_4_ = fVar133 * fVar95 - fVar164 * fVar143;
        auVar131._12_4_ = fVar134 * fVar96 - fVar167 * fVar145;
        auVar67._4_4_ = -(uint)(ABS(fVar132 * fVar126) < ABS(fVar161 * fVar141));
        auVar67._0_4_ = -(uint)(ABS(fVar130 * fVar124) < ABS(fVar156 * fVar138));
        auVar67._8_4_ = -(uint)(ABS(fVar133 * fVar127) < ABS(fVar164 * fVar143));
        auVar67._12_4_ = -(uint)(ABS(fVar134 * fVar128) < ABS(fVar167 * fVar145));
        auVar39._4_4_ = fVar88 * fVar141 - fVar132 * fVar126;
        auVar39._0_4_ = fVar85 * fVar138 - fVar130 * fVar124;
        auVar39._8_4_ = fVar89 * fVar143 - fVar133 * fVar127;
        auVar39._12_4_ = fVar90 * fVar145 - fVar134 * fVar128;
        local_878 = blendvps(auVar131,auVar39,auVar67);
        fVar89 = fVar146 * local_898._0_4_ + fVar97 * local_888._0_4_ + fStack_b30 * local_878._0_4_
        ;
        fVar90 = fVar146 * local_898._4_4_ + fVar97 * local_888._4_4_ + fStack_b30 * local_878._4_4_
        ;
        fVar92 = fVar146 * local_898._8_4_ + fVar97 * local_888._8_4_ + fStack_b30 * local_878._8_4_
        ;
        fVar94 = fVar146 * local_898._12_4_ +
                 fVar97 * local_888._12_4_ + fStack_b30 * local_878._12_4_;
        fVar89 = fVar89 + fVar89;
        fVar90 = fVar90 + fVar90;
        fVar92 = fVar92 + fVar92;
        fVar94 = fVar94 + fVar94;
        auVar73._0_4_ = fVar137 * local_888._0_4_ + fVar91 * local_878._0_4_;
        auVar73._4_4_ = fVar140 * local_888._4_4_ + fVar93 * local_878._4_4_;
        auVar73._8_4_ = fVar142 * local_888._8_4_ + fStack_ae0 * local_878._8_4_;
        auVar73._12_4_ = fVar144 * local_888._12_4_ + fStack_adc * local_878._12_4_;
        fVar146 = fVar98 * local_898._0_4_ + auVar73._0_4_;
        fVar77 = fVar99 * local_898._4_4_ + auVar73._4_4_;
        fVar85 = fVar100 * local_898._8_4_ + auVar73._8_4_;
        fVar88 = fVar101 * local_898._12_4_ + auVar73._12_4_;
        auVar42._4_4_ = fVar90;
        auVar42._0_4_ = fVar89;
        auVar42._8_4_ = fVar92;
        auVar42._12_4_ = fVar94;
        auVar69 = rcpps(auVar73,auVar42);
        fVar63 = auVar69._0_4_;
        fVar76 = auVar69._4_4_;
        fVar97 = auVar69._8_4_;
        fVar153 = auVar69._12_4_;
        local_8a8._0_4_ = ((1.0 - fVar89 * fVar63) * fVar63 + fVar63) * (fVar146 + fVar146);
        local_8a8._4_4_ = ((1.0 - fVar90 * fVar76) * fVar76 + fVar76) * (fVar77 + fVar77);
        local_8a8._8_4_ = ((1.0 - fVar92 * fVar97) * fVar97 + fVar97) * (fVar85 + fVar85);
        local_8a8._12_4_ = ((1.0 - fVar94 * fVar153) * fVar153 + fVar153) * (fVar88 + fVar88);
        fVar63 = *(float *)(ray + k * 4 + 0x80);
        fVar76 = *(float *)(ray + k * 4 + 0x30);
        auVar74._0_4_ =
             -(uint)(local_8a8._0_4_ <= fVar63 && fVar76 <= local_8a8._0_4_) & auVar150._0_4_;
        auVar74._4_4_ =
             -(uint)(local_8a8._4_4_ <= fVar63 && fVar76 <= local_8a8._4_4_) & auVar150._4_4_;
        auVar74._8_4_ =
             -(uint)(local_8a8._8_4_ <= fVar63 && fVar76 <= local_8a8._8_4_) & auVar150._8_4_;
        auVar74._12_4_ =
             -(uint)(local_8a8._12_4_ <= fVar63 && fVar76 <= local_8a8._12_4_) & auVar150._12_4_;
        iVar45 = movmskps(iVar45,auVar74);
        fStack_ad0 = fVar118;
        fStack_acc = fVar121;
        if (iVar45 != 0) {
          local_8d8._0_4_ = auVar74._0_4_ & -(uint)(fVar89 != 0.0);
          local_8d8._4_4_ = auVar74._4_4_ & -(uint)(fVar90 != 0.0);
          local_8d8._8_4_ = auVar74._8_4_ & -(uint)(fVar92 != 0.0);
          local_8d8._12_4_ = auVar74._12_4_ & -(uint)(fVar94 != 0.0);
          uVar47 = movmskps(iVar45,local_8d8);
          if (uVar47 != 0) {
            local_8f8._4_4_ = fVar81;
            local_8f8._0_4_ = fVar80;
            local_8f8._8_4_ = fVar102;
            local_8f8._12_4_ = fVar103;
            local_8e8 = &mapUV;
            auVar69 = rcpps(local_8a8,local_8f8);
            fVar76 = auVar69._0_4_;
            fVar97 = auVar69._4_4_;
            fVar153 = auVar69._8_4_;
            fVar146 = auVar69._12_4_;
            fVar76 = (float)(-(uint)(1e-18 <= ABS(fVar80)) &
                            (uint)(((float)DAT_01f46a60 - fVar80 * fVar76) * fVar76 + fVar76));
            fVar97 = (float)(-(uint)(1e-18 <= ABS(fVar81)) &
                            (uint)((DAT_01f46a60._4_4_ - fVar81 * fVar97) * fVar97 + fVar97));
            fVar153 = (float)(-(uint)(1e-18 <= ABS(fVar102)) &
                             (uint)((DAT_01f46a60._8_4_ - fVar102 * fVar153) * fVar153 + fVar153));
            fVar146 = (float)(-(uint)(1e-18 <= ABS(fVar103)) &
                             (uint)((DAT_01f46a60._12_4_ - fVar103 * fVar146) * fVar146 + fVar146));
            auVar87._0_4_ = local_918 * fVar76;
            auVar87._4_4_ = fStack_914 * fVar97;
            auVar87._8_4_ = fStack_910 * fVar153;
            auVar87._12_4_ = fStack_90c * fVar146;
            local_8c8 = minps(auVar87,_DAT_01f46a60);
            auVar139._0_4_ = fVar76 * local_908._0_4_;
            auVar139._4_4_ = fVar97 * local_908._4_4_;
            auVar139._8_4_ = fVar153 * local_908._8_4_;
            auVar139._12_4_ = fVar146 * local_908._12_4_;
            local_8b8 = minps(auVar139,_DAT_01f46a60);
            uVar59 = (ulong)(uVar47 & 0xff);
            do {
              uVar49 = 0;
              if (uVar59 != 0) {
                for (; (uVar59 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                }
              }
              local_808 = *(uint *)((long)&local_928 + uVar49 * 4);
              pGVar31 = (pSVar30->geometries).items[local_808].ptr;
              if ((pGVar31->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar31->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_838 = *(undefined4 *)(local_8c8 + uVar49 * 4);
                  uVar28 = *(undefined4 *)(local_8b8 + uVar49 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar49 * 4);
                  args.context = context->user;
                  uVar29 = *(undefined4 *)((long)&local_938 + uVar49 * 4);
                  local_818._4_4_ = uVar29;
                  local_818._0_4_ = uVar29;
                  local_818._8_4_ = uVar29;
                  local_818._12_4_ = uVar29;
                  local_828._4_4_ = uVar28;
                  local_828._0_4_ = uVar28;
                  local_828._8_4_ = uVar28;
                  local_828._12_4_ = uVar28;
                  uVar28 = *(undefined4 *)(local_898 + uVar49 * 4);
                  local_858 = *(undefined4 *)(local_888 + uVar49 * 4);
                  local_848 = *(undefined4 *)(local_878 + uVar49 * 4);
                  local_868[0] = (RTCHitN)(char)uVar28;
                  local_868[1] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_868[2] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_868[3] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  local_868[4] = (RTCHitN)(char)uVar28;
                  local_868[5] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_868[6] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_868[7] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  local_868[8] = (RTCHitN)(char)uVar28;
                  local_868[9] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_868[10] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_868[0xb] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  local_868[0xc] = (RTCHitN)(char)uVar28;
                  local_868[0xd] = (RTCHitN)(char)((uint)uVar28 >> 8);
                  local_868[0xe] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                  local_868[0xf] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  uStack_844 = local_848;
                  uStack_840 = local_848;
                  uStack_83c = local_848;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  local_7f8 = (args.context)->instID[0];
                  uStack_7f4 = local_7f8;
                  uStack_7f0 = local_7f8;
                  uStack_7ec = local_7f8;
                  local_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = local_7e8;
                  uStack_7e0 = local_7e8;
                  uStack_7dc = local_7e8;
                  local_a78 = *local_a68;
                  args.valid = (int *)local_a78;
                  args.geometryUserPtr = pGVar31->userPtr;
                  args.hit = local_868;
                  args.N = 4;
                  fStack_b30 = 0.0;
                  fStack_b2c = 0.0;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar31->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar31->occlusionFilterN)(&args);
                  }
                  if (local_a78 == (undefined1  [16])0x0) {
                    auVar75._8_4_ = 0xffffffff;
                    auVar75._0_8_ = 0xffffffffffffffff;
                    auVar75._12_4_ = 0xffffffff;
                    auVar75 = auVar75 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var34 = context->args->filter;
                    if ((p_Var34 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar31->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var34)(&args);
                    }
                    auVar68._0_4_ = -(uint)(local_a78._0_4_ == 0);
                    auVar68._4_4_ = -(uint)(local_a78._4_4_ == 0);
                    auVar68._8_4_ = -(uint)(local_a78._8_4_ == 0);
                    auVar68._12_4_ = -(uint)(local_a78._12_4_ == 0);
                    auVar75 = auVar68 ^ _DAT_01f46b70;
                    auVar69 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar68
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar69;
                  }
                  if ((_DAT_01f46b40 & auVar75) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar63;
                    goto LAB_006fd13d;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_006fd22e;
              }
LAB_006fd13d:
              uVar59 = uVar59 ^ 1L << (uVar49 & 0x3f);
            } while (uVar59 != 0);
          }
        }
      }
      uVar59 = local_a60;
    }
LAB_006fd203:
    local_b50 = local_b58;
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }